

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  undefined1 auVar1 [8];
  size_t sVar2;
  int iVar3;
  int code;
  AutoCloseFd AVar4;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *extraout_RDX_02;
  ReadableFile *extraout_RDX_03;
  ReadableFile *pRVar5;
  AutoCloseFd *pAVar6;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar7;
  AutoCloseFd result;
  undefined1 local_68 [8];
  size_t sStack_60;
  ArrayDisposer *local_58;
  AutoCloseFd *local_50;
  AutoCloseFd local_48;
  PathPtr local_40;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  local_50 = &this->fd;
  while( true ) {
    iVar3 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString((String *)local_68,&local_40,false);
    AVar4 = (AutoCloseFd)((long)"\n\n" + 2);
    if (sStack_60 != 0) {
      AVar4 = (AutoCloseFd)local_68;
    }
    iVar3 = openat(iVar3,(char *)AVar4,0x80000);
    sVar2 = sStack_60;
    auVar1 = local_68;
    pRVar5 = extraout_RDX;
    if ((AutoCloseFd)local_68 != (AutoCloseFd)0x0) {
      local_68._0_4_ = 0;
      local_68._4_4_ = 0;
      sStack_60 = 0;
      (**local_58->_vptr_ArrayDisposer)(local_58,auVar1,1,sVar2,sVar2,0);
      pRVar5 = extraout_RDX_00;
    }
    if (-1 < iVar3) break;
    code = kj::_::Debug::getOsErrorNumber(false);
    pRVar5 = extraout_RDX_01;
    if (code != -1) {
LAB_00258a7c:
      if (code == 0) {
        local_68._0_4_ = iVar3;
        UnwindDetector::UnwindDetector((UnwindDetector *)(local_68 + 4));
        local_48.fd = local_68._0_4_;
        UnwindDetector::UnwindDetector(&local_48.unwindDetector);
        local_68._0_4_ = -1;
        AVar4 = (AutoCloseFd)operator_new(0x10);
        pAVar6 = local_50;
        *(undefined ***)AVar4 = &PTR_getFd_002d1c90;
        *(int *)((long)AVar4 + 8) = local_48.fd;
        UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar4 + 0xc));
        local_48.fd = -1;
        *(undefined ***)AVar4 = &PTR_getFd_002d11e0;
        *pAVar6 = (AutoCloseFd)
                  &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
        pAVar6[1] = AVar4;
        AutoCloseFd::~AutoCloseFd(&local_48);
        AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_68);
        pRVar5 = extraout_RDX_02;
      }
      else if ((code == 0x14) || (code == 2)) {
        local_50->fd = 0;
        local_50->unwindDetector = 0;
        local_50[1].fd = 0;
        local_50[1].unwindDetector = 0;
        pAVar6 = local_50;
      }
      else {
        kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                  ((Fault *)local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x2e9,code,"openat(fd, path, O_RDONLY)","path",&local_40);
        pAVar6 = local_50;
        local_50->fd = 0;
        local_50->unwindDetector = 0;
        local_50[1].fd = 0;
        local_50[1].unwindDetector = 0;
        kj::_::Debug::Fault::~Fault((Fault *)local_68);
        pRVar5 = extraout_RDX_03;
      }
      MVar7.ptr.ptr = pRVar5;
      MVar7.ptr.disposer = (Disposer *)pAVar6;
      return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar7.ptr;
    }
  }
  code = 0;
  goto LAB_00258a7c;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }